

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_unpackhi_u8_s16(c_v64 a)

{
  return (c_v64)(a.u64 >> 0x20 & 0xff |
                a.u64 >> 0x10 & 0xff00000000 | a.u64 >> 8 & 0xff000000000000 |
                (ulong)((uint)((ulong)a >> 0x18) & 0xff0000));
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpackhi_u8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.u8[7 - endian];
  t.s16[2] = (int16_t)a.u8[6 - endian];
  t.s16[1] = (int16_t)a.u8[5 - endian];
  t.s16[0] = (int16_t)a.u8[4 - endian];
  return t;
}